

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStructMatrix.cpp
# Opt level: O2

void __thiscall
TPZStructMatrix::TPZStructMatrix(TPZStructMatrix *this,void **vtt,TPZAutoPointer<TPZCompMesh> *mesh)

{
  _Rb_tree_header *p_Var1;
  void *pvVar2;
  TPZAutoPointer<TPZCompMesh> local_28;
  
  pvVar2 = *vtt;
  *(void **)this = pvVar2;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar2 + -0x60)) = vtt[1];
  *(void **)(&this->field_0x0 + *(long *)(*(long *)this + -0x68)) = vtt[2];
  this->fMesh = (TPZCompMesh *)0x0;
  TPZAutoPointer<TPZCompMesh>::TPZAutoPointer(&this->fCompMesh,(TPZCompMesh *)0x0);
  p_Var1 = &(this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->fEquationFilter).super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZEquationFilter_017d8460;
  (this->fEquationFilter).fNumEq = 0;
  (this->fEquationFilter).fIsActive = false;
  (this->fEquationFilter).fActiveEqs._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  (this->fEquationFilter).fActiveEqs.fStore = (long *)0x0;
  (this->fEquationFilter).fActiveEqs.fNElements = 0;
  (this->fEquationFilter).fActiveEqs.fNAlloc = 0;
  (this->fEquationFilter).fDestIndices._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  (this->fEquationFilter).fDestIndices.fNAlloc = 0;
  (this->fEquationFilter).fDestIndices.fStore = (long *)0x0;
  (this->fEquationFilter).fDestIndices.fNElements = 0;
  local_28 = (TPZAutoPointer<TPZCompMesh>)mesh->fRef;
  LOCK();
  ((local_28.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_28.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  SetMesh(this,&local_28);
  TPZAutoPointer<TPZCompMesh>::~TPZAutoPointer(&local_28);
  return;
}

Assistant:

TPZStructMatrix::TPZStructMatrix(TPZAutoPointer<TPZCompMesh> mesh)
    : TPZStrMatParInterface(), fEquationFilter(0) {
    SetMesh(mesh);
}